

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O3

bool __thiscall glslang::TType::tensorParameterOK(TType *this,TType *right)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = (*this->_vptr_TType[7])();
  if (iVar1 == 0x17) {
    iVar1 = (*right->_vptr_TType[7])(right);
    if (iVar1 != 0x17) {
      return false;
    }
  }
  else {
    iVar1 = (*this->_vptr_TType[7])(this);
    if (iVar1 != 0x18) {
      return false;
    }
    iVar1 = (*right->_vptr_TType[7])(right);
    if (iVar1 != 0x18) {
      return false;
    }
  }
  bVar2 = false;
  if (right->typeParameters == (TTypeParameters *)0x0) {
    bVar2 = this->typeParameters != (TTypeParameters *)0x0;
  }
  return bVar2;
}

Assistant:

bool tensorParameterOK(const TType& right) const
    {
        if (isTensorLayoutNV()) {
            return right.isTensorLayoutNV() && right.typeParameters == nullptr && typeParameters != nullptr;
        }
        if (isTensorViewNV()) {
            return right.isTensorViewNV() && right.typeParameters == nullptr && typeParameters != nullptr;
        }
        return false;
    }